

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int find_jump_target(JSFunctionDef *s,int label,int *pop,int *pline)

{
  LabelSlot *pLVar1;
  uint8_t *puVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  
  pLVar1 = s->label_slots;
  pLVar1[label].ref_count = pLVar1[label].ref_count + -1;
  puVar2 = (s->byte_code).buf;
  iVar3 = 0;
LAB_00161e5c:
  iVar5 = pLVar1[label].pos2;
  do {
    bVar4 = puVar2[iVar5];
    if (bVar4 < 0xc0) {
      if (bVar4 != 0xb4) goto LAB_00161ea7;
    }
    else {
      if (bVar4 != 0xc0) goto LAB_00161edd;
      if (pline != (int *)0x0) {
        *pline = *(int *)(puVar2 + (long)iVar5 + 1);
      }
    }
    iVar5 = iVar5 + (uint)opcode_info[bVar4].size;
  } while( true );
code_r0x00161ebe:
  bVar4 = 0x6b;
  goto LAB_00161edd;
LAB_00161ea7:
  if (bVar4 != 0xe) {
    if (bVar4 != 0x6b) goto LAB_00161edd;
    label = *(int *)(puVar2 + (long)iVar5 + 1);
    iVar3 = iVar3 + 1;
    if (iVar3 == 10) goto code_r0x00161ebe;
    goto LAB_00161e5c;
  }
  puVar2 = puVar2 + iVar5;
  do {
    puVar2 = puVar2 + 1;
  } while (*puVar2 == '\x0e');
  if (*puVar2 == ')') {
    bVar4 = 0x29;
  }
LAB_00161edd:
  *pop = (uint)bVar4;
  pLVar1[label].ref_count = pLVar1[label].ref_count + 1;
  return label;
}

Assistant:

static int find_jump_target(JSFunctionDef *s, int label, int *pop, int *pline)
{
    int i, pos, op;

    update_label(s, label, -1);
    for (i = 0; i < 10; i++) {
        assert(label >= 0 && label < s->label_count);
        pos = s->label_slots[label].pos2;
        for (;;) {
            switch(op = s->byte_code.buf[pos]) {
            case OP_line_num:
                if (pline)
                    *pline = get_u32(s->byte_code.buf + pos + 1);
                /* fall thru */
            case OP_label:
                pos += opcode_info[op].size;
                continue;
            case OP_goto:
                label = get_u32(s->byte_code.buf + pos + 1);
                break;
            case OP_drop:
                /* ignore drop opcodes if followed by OP_return_undef */
                while (s->byte_code.buf[++pos] == OP_drop)
                    continue;
                if (s->byte_code.buf[pos] == OP_return_undef)
                    op = OP_return_undef;
                /* fall thru */
            default:
                goto done;
            }
            break;
        }
    }
    /* cycle detected, could issue a warning */
 done:
    *pop = op;
    update_label(s, label, +1);
    return label;
}